

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O1

char ** mk_attrib_list(char *comma_sep_attrib)

{
  ulong uVar1;
  char *pcVar2;
  char *__s;
  char *pcVar3;
  char **ppcVar4;
  ulong uVar5;
  
  strncpy(mk_attrib_list::buf,comma_sep_attrib,0x400);
  pcVar2 = comma_whacker(mk_attrib_list::buf);
  ppcVar4 = mk_attrib_list::attrib_list;
  pcVar3 = comma_whacker::p;
  uVar5 = 0;
  do {
    __s = pcVar3;
    *ppcVar4 = pcVar2;
    pcVar3 = __s;
    if ((__s != (char *)0x0) &&
       (pcVar3 = strchr(__s,0x2c), comma_whacker::p = pcVar3, comma_whacker::nxt = pcVar3,
       pcVar3 != (char *)0x0)) {
      *pcVar3 = '\0';
    }
    ppcVar4 = ppcVar4 + 1;
    uVar1 = uVar5 + 1;
  } while ((uVar5 < 4) && (pcVar2 = __s, uVar5 = uVar1, __s != (char *)0x0));
  *ppcVar4 = (char *)0x0;
  if (uVar1 == 6) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
            ,0x6a,"Attribute list may be truncated for acoustic model, increase MAX_N_ATTRIB\n");
  }
  return mk_attrib_list::attrib_list;
}

Assistant:

const char **
mk_attrib_list(char *comma_sep_attrib)
{
    static char *attrib_list[MAX_N_ATTRIB+1];
    static char buf[1024];
    uint32 i;
    char *attr;

    strncpy (buf, comma_sep_attrib, 1024);

    attr = comma_whacker(buf);
    i = 0;

    do {
	attrib_list[i++] = attr;
    } while ((attr = comma_whacker(NULL)) && (i < MAX_N_ATTRIB));
    attrib_list[i] = NULL;

    if (i == MAX_N_ATTRIB+1) {
	E_WARN("Attribute list may be truncated for acoustic model, increase MAX_N_ATTRIB\n");
    }
    
    return (const char **)attrib_list;
}